

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::TranslateToFuzzReader
          (TranslateToFuzzReader *this,Module *wasm,string *filename,bool closedWorld)

{
  _Vector_base<char,_std::allocator<char>_> local_40;
  
  ::wasm::read_file<std::vector<char,std::allocator<char>>>
            ((string *)&local_40,(BinaryOption)filename);
  TranslateToFuzzReader(this,wasm,(vector<char,_std::allocator<char>_> *)&local_40,closedWorld);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

TranslateToFuzzReader::TranslateToFuzzReader(Module& wasm,
                                             std::string& filename,
                                             bool closedWorld)
  : TranslateToFuzzReader(wasm,
                          read_file<std::vector<char>>(filename, Flags::Binary),
                          closedWorld) {}